

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> * __thiscall
TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::get_bucket
          (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
           *this,uint index)

{
  pointer ppvVar1;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar2;
  ulong uVar3;
  
  uVar3 = (ulong)index;
  ppvVar1 = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3)) {
    pvVar2 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)ppvVar1[uVar3];
    if (pvVar2 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      pvVar2 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
      (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1[uVar3] = pvVar2;
    }
  }
  else {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,(ulong)(index + 1));
    pvVar2 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
    (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar2->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = pvVar2;
  }
  return pvVar2;
}

Assistant:

BucketT* get_bucket(unsigned index)
	{
		if (index < _buckets.size()) {
			BucketT* b = static_cast<BucketT*>(_buckets[index]);
			if (not b) { _buckets[index] = b = new BucketT; }
			return b;
		} else {
			_buckets.resize(index+1);
			BucketT* b = new BucketT;
			_buckets[index] = b;
			return b;
		}
	}